

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

LinearSpace3fa * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx::CurveGeometryInterface,_embree::CatmullRomCurveT>
::computeAlignedSpace
          (LinearSpace3fa *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx::CurveGeometryInterface,_embree::CatmullRomCurveT>
          *this,size_t primID)

{
  uint uVar1;
  BufferView<embree::Vec3fx> *pBVar2;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  vfloat4 a0_1;
  undefined1 auVar7 [16];
  vfloat4 a0;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar16;
  undefined1 auVar17 [16];
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  
  pBVar2 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           vertices.items;
  uVar1 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   primID * *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>)
                                      .super_CurveGeometry.field_0x68);
  pcVar3 = (pBVar2->super_RawBufferView).ptr_ofs;
  sVar4 = (pBVar2->super_RawBufferView).stride;
  lVar5 = (uVar1 + 1) * sVar4;
  lVar6 = (uVar1 + 2) * sVar4;
  fVar18 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
           maxRadiusScale;
  auVar14 = vinsertps_avx(*(undefined1 (*) [16])(pcVar3 + lVar5),
                          ZEXT416((uint)(fVar18 * *(float *)(pcVar3 + lVar5 + 0xc))),0x30);
  auVar13 = vinsertps_avx(*(undefined1 (*) [16])(pcVar3 + lVar6),
                          ZEXT416((uint)(fVar18 * *(float *)(pcVar3 + lVar6 + 0xc))),0x30);
  auVar9 = vsubps_avx(auVar13,auVar14);
  auVar8 = vdpps_avx(auVar9,auVar9,0x7f);
  auVar10 = vrsqrtss_avx(auVar8,auVar8);
  fVar22 = auVar10._0_4_;
  lVar5 = (uVar1 + 3) * sVar4;
  auVar10 = ZEXT416((uint)(fVar22 * 1.5 - auVar8._0_4_ * 0.5 * fVar22 * fVar22 * fVar22));
  auVar10 = vshufps_avx(auVar10,auVar10,0);
  auVar7._0_4_ = auVar9._0_4_ * auVar10._0_4_;
  auVar7._4_4_ = auVar9._4_4_ * auVar10._4_4_;
  auVar7._8_4_ = auVar9._8_4_ * auVar10._8_4_;
  auVar7._12_4_ = auVar9._12_4_ * auVar10._12_4_;
  if (1e-18 < auVar8._0_4_) {
    auVar8 = vinsertps_avx(*(undefined1 (*) [16])(pcVar3 + uVar1 * sVar4),
                           ZEXT416((uint)(fVar18 * *(float *)(pcVar3 + uVar1 * sVar4 + 0xc))),0x30);
    auVar10 = vinsertps_avx(*(undefined1 (*) [16])(pcVar3 + lVar5),
                            ZEXT416((uint)(fVar18 * *(float *)(pcVar3 + lVar5 + 0xc))),0x30);
    auVar9._0_4_ = auVar14._0_4_ * 0.0 + auVar13._0_4_ * 0.5 + auVar10._0_4_ * 0.0;
    auVar9._4_4_ = auVar14._4_4_ * 0.0 + auVar13._4_4_ * 0.5 + auVar10._4_4_ * 0.0;
    auVar9._8_4_ = auVar14._8_4_ * 0.0 + auVar13._8_4_ * 0.5 + auVar10._8_4_ * 0.0;
    auVar9._12_4_ = auVar14._12_4_ * 0.0 + auVar13._12_4_ * 0.5 + auVar10._12_4_ * 0.0;
    auVar14._0_4_ = auVar8._0_4_ * 0.5;
    auVar14._4_4_ = auVar8._4_4_ * 0.5;
    auVar14._8_4_ = auVar8._8_4_ * 0.5;
    auVar14._12_4_ = auVar8._12_4_ * 0.5;
    auVar13 = vsubps_avx(auVar9,auVar14);
    auVar8 = vshufps_avx(auVar13,auVar13,0xc9);
    auVar14 = vshufps_avx(auVar7,auVar7,0xc9);
    auVar10._0_4_ = auVar13._0_4_ * auVar14._0_4_;
    auVar10._4_4_ = auVar13._4_4_ * auVar14._4_4_;
    auVar10._8_4_ = auVar13._8_4_ * auVar14._8_4_;
    auVar10._12_4_ = auVar13._12_4_ * auVar14._12_4_;
    auVar13._0_4_ = auVar8._0_4_ * auVar7._0_4_;
    auVar13._4_4_ = auVar8._4_4_ * auVar7._4_4_;
    auVar13._8_4_ = auVar8._8_4_ * auVar7._8_4_;
    auVar13._12_4_ = auVar8._12_4_ * auVar7._12_4_;
    auVar8 = vsubps_avx(auVar13,auVar10);
    auVar8 = vshufps_avx(auVar8,auVar8,0xc9);
  }
  else {
    auVar8 = ZEXT816(0x3f80000000000000);
    auVar7 = _DAT_01f7b700;
  }
  auVar14 = vdpps_avx(auVar8,auVar8,0x7f);
  if (auVar14._0_4_ <= 1e-18) {
    auVar14 = vshufpd_avx(auVar7,auVar7,1);
    auVar8 = vmovshdup_avx(auVar7);
    auVar20._8_4_ = 0x80000000;
    auVar20._0_8_ = 0x8000000080000000;
    auVar20._12_4_ = 0x80000000;
    auVar17._0_4_ = auVar8._0_4_ ^ 0x80000000;
    auVar8 = vunpckhps_avx(auVar7,ZEXT816(0) << 0x40);
    auVar17._4_12_ = ZEXT812(0) << 0x20;
    auVar10 = vshufps_avx(auVar8,auVar17,0x41);
    auVar8._0_8_ = auVar14._0_8_ ^ 0x8000000080000000;
    auVar8._8_8_ = auVar14._8_8_ ^ auVar20._8_8_;
    auVar13 = vinsertps_avx(auVar8,auVar7,0x2a);
    auVar8 = vdpps_avx(auVar10,auVar10,0x7f);
    auVar14 = vdpps_avx(auVar13,auVar13,0x7f);
    auVar8 = vcmpps_avx(auVar14,auVar8,1);
    auVar8 = vshufps_avx(auVar8,auVar8,0);
    auVar8 = vblendvps_avx(auVar13,auVar10,auVar8);
    auVar14 = vdpps_avx(auVar8,auVar8,0x7f);
    auVar13 = vrsqrtss_avx(auVar14,auVar14);
    fVar18 = auVar13._0_4_;
    auVar14 = ZEXT416((uint)(fVar18 * 1.5 - auVar14._0_4_ * 0.5 * fVar18 * fVar18 * fVar18));
    auVar14 = vshufps_avx(auVar14,auVar14,0);
    aVar16._0_4_ = auVar8._0_4_ * auVar14._0_4_;
    aVar16._4_4_ = auVar8._4_4_ * auVar14._4_4_;
    aVar16._8_4_ = auVar8._8_4_ * auVar14._8_4_;
    aVar16._12_4_ = auVar8._12_4_ * auVar14._12_4_;
    auVar8 = vshufps_avx((undefined1  [16])aVar16,(undefined1  [16])aVar16,0xc9);
    auVar14 = vshufps_avx(auVar7,auVar7,0xc9);
    auVar21._0_4_ = auVar14._0_4_ * aVar16._0_4_;
    auVar21._4_4_ = auVar14._4_4_ * aVar16._4_4_;
    auVar21._8_4_ = auVar14._8_4_ * aVar16._8_4_;
    auVar21._12_4_ = auVar14._12_4_ * aVar16._12_4_;
    auVar12._0_4_ = auVar7._0_4_ * auVar8._0_4_;
    auVar12._4_4_ = auVar7._4_4_ * auVar8._4_4_;
    auVar12._8_4_ = auVar7._8_4_ * auVar8._8_4_;
    auVar12._12_4_ = auVar7._12_4_ * auVar8._12_4_;
    auVar8 = vsubps_avx(auVar12,auVar21);
    auVar13 = vshufps_avx(auVar8,auVar8,0xc9);
    auVar8 = vdpps_avx(auVar13,auVar13,0x7f);
    auVar14 = vrsqrtss_avx(auVar8,auVar8);
    fVar18 = auVar14._0_4_;
    auVar8 = ZEXT416((uint)(fVar18 * 1.5 - auVar8._0_4_ * 0.5 * fVar18 * fVar18 * fVar18));
    auVar8 = vshufps_avx(auVar8,auVar8,0);
    aVar11._0_4_ = auVar8._0_4_ * auVar13._0_4_;
    aVar11._4_4_ = auVar8._4_4_ * auVar13._4_4_;
    aVar11._8_4_ = auVar8._8_4_ * auVar13._8_4_;
    aVar11._12_4_ = auVar8._12_4_ * auVar13._12_4_;
  }
  else {
    auVar13 = vrsqrtss_avx(auVar14,auVar14);
    fVar18 = auVar13._0_4_;
    auVar14 = ZEXT416((uint)(fVar18 * 1.5 - auVar14._0_4_ * 0.5 * fVar18 * fVar18 * fVar18));
    auVar14 = vshufps_avx(auVar14,auVar14,0);
    aVar11._0_4_ = auVar8._0_4_ * auVar14._0_4_;
    aVar11._4_4_ = auVar8._4_4_ * auVar14._4_4_;
    aVar11._8_4_ = auVar8._8_4_ * auVar14._8_4_;
    aVar11._12_4_ = auVar8._12_4_ * auVar14._12_4_;
    auVar8 = vshufps_avx(auVar7,auVar7,0xc9);
    auVar14 = vshufps_avx((undefined1  [16])aVar11,(undefined1  [16])aVar11,0xc9);
    auVar19._0_4_ = auVar7._0_4_ * auVar14._0_4_;
    auVar19._4_4_ = auVar7._4_4_ * auVar14._4_4_;
    auVar19._8_4_ = auVar7._8_4_ * auVar14._8_4_;
    auVar19._12_4_ = auVar7._12_4_ * auVar14._12_4_;
    auVar15._0_4_ = auVar8._0_4_ * aVar11._0_4_;
    auVar15._4_4_ = auVar8._4_4_ * aVar11._4_4_;
    auVar15._8_4_ = auVar8._8_4_ * aVar11._8_4_;
    auVar15._12_4_ = auVar8._12_4_ * aVar11._12_4_;
    auVar8 = vsubps_avx(auVar15,auVar19);
    auVar13 = vshufps_avx(auVar8,auVar8,0xc9);
    auVar8 = vdpps_avx(auVar13,auVar13,0x7f);
    auVar14 = vrsqrtss_avx(auVar8,auVar8);
    fVar18 = auVar14._0_4_;
    auVar8 = ZEXT416((uint)(fVar18 * 1.5 - auVar8._0_4_ * 0.5 * fVar18 * fVar18 * fVar18));
    auVar8 = vshufps_avx(auVar8,auVar8,0);
    aVar16._0_4_ = auVar8._0_4_ * auVar13._0_4_;
    aVar16._4_4_ = auVar8._4_4_ * auVar13._4_4_;
    aVar16._8_4_ = auVar8._8_4_ * auVar13._8_4_;
    aVar16._12_4_ = auVar8._12_4_ * auVar13._12_4_;
  }
  (__return_storage_ptr__->vx).field_0 = aVar16;
  (__return_storage_ptr__->vy).field_0 = aVar11;
  *(undefined1 (*) [16])(__return_storage_ptr__->vz).field_0.m128 = auVar7;
  return __return_storage_ptr__;
}

Assistant:

LinearSpace3fa computeAlignedSpace(const size_t primID) const
      {
        Vec3fa axisz(0,0,1);
        Vec3fa axisy(0,1,0);
        
        const Curve3ff curve = getCurveScaledRadius(primID);
        const Vec3fa p0 = curve.begin();
        const Vec3fa p3 = curve.end();
        const Vec3fa d0 = curve.eval_du(0.0f);
        //const Vec3fa d1 = curve.eval_du(1.0f);
        const Vec3fa axisz_ = normalize(p3 - p0);
        const Vec3fa axisy_ = cross(axisz_,d0);
        if (sqr_length(p3-p0) > 1E-18f) {
          axisz = axisz_;
          axisy = axisy_;
        }
        
        if (sqr_length(axisy) > 1E-18) {
          axisy = normalize(axisy);
          Vec3fa axisx = normalize(cross(axisy,axisz));
          return LinearSpace3fa(axisx,axisy,axisz);
        }
        return frame(axisz);
      }